

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSeq.c
# Opt level: O0

Vec_Ptr_t * Sim_SimulateSeqRandom(Abc_Ntk_t *pNtk,int nFrames,int nWords)

{
  int iVar1;
  Vec_Ptr_t *vInfo_00;
  Abc_Obj_t *pAVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vInfo;
  int nWords_local;
  int nFrames_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 != 0) {
    iVar1 = Abc_NtkObjNumMax(pNtk);
    vInfo_00 = Sim_UtilInfoAlloc(iVar1,nWords * nFrames,0);
    pAVar2 = Abc_AigConst1(pNtk);
    Sim_UtilSetConst((uint *)vInfo_00->pArray[pAVar2->Id],nWords * nFrames,1);
    for (local_2c = 0; iVar1 = Abc_NtkPiNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
      pAVar2 = Abc_NtkPi(pNtk,local_2c);
      Sim_UtilSetRandom((uint *)vInfo_00->pArray[pAVar2->Id],nWords * nFrames);
    }
    for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_2c < iVar1; local_2c = local_2c + 1)
    {
      pAVar2 = Abc_NtkBox(pNtk,local_2c);
      iVar1 = Abc_ObjIsLatch(pAVar2);
      if (iVar1 != 0) {
        iVar1 = Abc_LatchIsInit0(pAVar2);
        if (iVar1 == 0) {
          iVar1 = Abc_LatchIsInit1(pAVar2);
          if (iVar1 == 0) {
            Sim_UtilSetRandom((uint *)vInfo_00->pArray[pAVar2->Id],nWords);
          }
          else {
            Sim_UtilSetConst((uint *)vInfo_00->pArray[pAVar2->Id],nWords,1);
          }
        }
        else {
          Sim_UtilSetConst((uint *)vInfo_00->pArray[pAVar2->Id],nWords,0);
        }
      }
    }
    for (local_2c = 0; local_2c < nFrames; local_2c = local_2c + 1) {
      Sim_SimulateSeqFrame(vInfo_00,pNtk,local_2c,nWords,(uint)(local_2c < nFrames + -1));
    }
    return vInfo_00;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSeq.c"
                ,0x38,"Vec_Ptr_t *Sim_SimulateSeqRandom(Abc_Ntk_t *, int, int)");
}

Assistant:

Vec_Ptr_t * Sim_SimulateSeqRandom( Abc_Ntk_t * pNtk, int nFrames, int nWords )
{
    Vec_Ptr_t * vInfo;
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    vInfo = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), nWords * nFrames, 0 );
    // set the constant data
    pNode = Abc_AigConst1(pNtk);
    Sim_UtilSetConst( Sim_SimInfoGet(vInfo,pNode), nWords * nFrames, 1 );
    // set the random PI data
    Abc_NtkForEachPi( pNtk, pNode, i )
        Sim_UtilSetRandom( Sim_SimInfoGet(vInfo,pNode), nWords * nFrames );
    // set the initial state data
    Abc_NtkForEachLatch( pNtk, pNode, i )
        if ( Abc_LatchIsInit0(pNode) )
            Sim_UtilSetConst( Sim_SimInfoGet(vInfo,pNode), nWords, 0 );
        else if ( Abc_LatchIsInit1(pNode) )
            Sim_UtilSetConst( Sim_SimInfoGet(vInfo,pNode), nWords, 1 );
        else 
            Sim_UtilSetRandom( Sim_SimInfoGet(vInfo,pNode), nWords );
    // simulate the nodes for the given number of timeframes
    for ( i = 0; i < nFrames; i++ )
        Sim_SimulateSeqFrame( vInfo, pNtk, i, nWords, (int)(i < nFrames-1) );
    return vInfo;
}